

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O0

void __thiscall jaegertracing::Tracer::Close(Tracer *this)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer pRVar3;
  Tracer *this_local;
  
  peVar1 = std::
           __shared_ptr_access<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_reporter);
  (*peVar1->_vptr_Reporter[3])();
  peVar2 = std::
           __shared_ptr_access<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_sampler);
  (*peVar2->_vptr_Sampler[3])();
  pRVar3 = std::
           unique_ptr<jaegertracing::baggage::RestrictionManager,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
           ::operator->(&this->_restrictionManager);
  (*pRVar3->_vptr_RestrictionManager[3])();
  return;
}

Assistant:

void Close() noexcept override
    {
        try {
            _reporter->close();
            _sampler->close();
            _restrictionManager->close();
        } catch (...) {
            utils::ErrorUtil::logError(*_logger,
                                       "Error occurred in Tracer::Close");
        }
    }